

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O1

TestSuite * __thiscall
iutest::UnitTestImpl::AddTestSuite<iutest::TypedTestSuite<char16_t>>
          (UnitTestImpl *this,string *testsuite_name,TestTypeId id,SetUpMethod setup,
          TearDownMethod teardown)

{
  pointer *pppTVar1;
  iterator __position;
  TypedTestSuite<char16_t> *this_00;
  TestSuite *p;
  TypedTestSuite<char16_t> *local_48;
  FindOp local_40;
  
  local_40.m_name = (testsuite_name->_M_dataplus)._M_p;
  local_40.m_id = id;
  local_48 = (TypedTestSuite<char16_t> *)
             detail::FindList<iutest::TestSuite*,iutest::TestSuite::FindOp>
                       (&this->m_testsuites,&local_40);
  if (local_48 == (TypedTestSuite<char16_t> *)0x0) {
    this_00 = (TypedTestSuite<char16_t> *)operator_new(0xd0);
    TypedTestSuite<char16_t>::TypedTestSuite(this_00,testsuite_name,id,setup,teardown);
    __position._M_current =
         (this->m_testsuites).
         super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_48 = this_00;
    if (__position._M_current ==
        (this->m_testsuites).
        super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<iutest::TestSuite*,std::allocator<iutest::TestSuite*>>::
      _M_realloc_insert<iutest::TestSuite*const&>
                ((vector<iutest::TestSuite*,std::allocator<iutest::TestSuite*>> *)
                 &this->m_testsuites,__position,(TestSuite **)&local_48);
    }
    else {
      *__position._M_current = (TestSuite *)this_00;
      pppTVar1 = &(this->m_testsuites).
                  super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  return &local_48->super_TestSuite;
}

Assistant:

TestSuite* AddTestSuite(const ::std::string& testsuite_name, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown IUTEST_APPEND_EXPLICIT_TEMPLATE_TYPE_(T) )
    {
        TestSuite* p = FindTestSuite(testsuite_name, id);
        if( p == NULL )
        {
            p = new T (testsuite_name, id, setup, teardown);
            m_testsuites.push_back(p);
        }
        return p;
    }